

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCpuId.cpp
# Opt level: O0

void testCpuId(string *param_1)

{
  ostream *poVar1;
  void *this;
  CpuId cpuId;
  CpuId local_f;
  byte local_e;
  byte local_d;
  byte local_c;
  byte local_b;
  byte local_a;
  byte local_9;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"IMF_HAVE_SSE2: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,true);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"IMF_HAVE_SSE4_1: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,false);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"IMF_HAVE_AVX: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,false);
  std::operator<<(poVar1,"\n");
  Imf_3_4::CpuId::CpuId(&local_f);
  poVar1 = std::operator<<((ostream *)&std::cout,"cpuId.sse2: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)((byte)local_f & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"cpuId.sse3: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_e & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"cpuId.ssse3: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_d & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"cpuId.sse4_1: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_c & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"cpuId.sse4_2: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_b & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"cpuId.avx: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_a & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"cpuId.f16c: ");
  this = (void *)std::ostream::operator<<(poVar1,(bool)(local_9 & 1));
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testCpuId (const string&)
{
#if defined(IMF_HAVE_SSE2)
    std::cout << "IMF_HAVE_SSE2: " << true << "\n";
#else
    std::cout << "IMF_HAVE_SSE2: " << false << "\n";
#endif
#if defined(IMF_HAVE_SSE4_1)
    std::cout << "IMF_HAVE_SSE4_1: " << true << "\n";
#else
    std::cout << "IMF_HAVE_SSE4_1: " << false << "\n";
#endif
#if defined(IMF_HAVE_AVX)
    std::cout << "IMF_HAVE_AVX: " << true << "\n";
#else
    std::cout << "IMF_HAVE_AVX: " << false << "\n";
#endif

    OPENEXR_IMF_NAMESPACE::CpuId cpuId;
    std::cout << "cpuId.sse2: " << cpuId.sse2 << "\n";
    std::cout << "cpuId.sse3: " << cpuId.sse3 << "\n";
    std::cout << "cpuId.ssse3: " << cpuId.ssse3 << "\n";
    std::cout << "cpuId.sse4_1: " << cpuId.sse4_1 << "\n";
    std::cout << "cpuId.sse4_2: " << cpuId.sse4_2 << "\n";
    std::cout << "cpuId.avx: " << cpuId.avx << "\n";
    std::cout << "cpuId.f16c: " << cpuId.f16c << std::endl;
}